

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteMessageTests::TestnewOrderListSetString::~TestnewOrderListSetString
          (TestnewOrderListSetString *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(newOrderListSetString)
{
  FIX42::NewOrderList object;

  DataDictionary dataDictionary( "../spec/FIX42.xml" );

  object.setString
    ( "8=FIX.4.2\0019=95\00135=E\00166=1\00168=3\00173=3\001"
      "11=A\00154=1\00155=DELL\00167=1\001"
      "11=B\00154=2\00155=LNUX\00167=2\001"
      "11=C\00154=3\00155=RHAT\00167=3\001"
      "394=0\00110=233\001", true, &dataDictionary );

  ListID listID;
  BidType bidType;
  TotNoOrders totNoOrders;

  object.get( listID );
  object.get( bidType );
  object.get( totNoOrders );

  ClOrdID clOrdID;
  ListSeqNo listSeqNo;
  Symbol symbol;
  Side side;

  FIX42::NewOrderList::NoOrders group;
  object.getGroup( 1, group );
  group.get( clOrdID );
  group.get( listSeqNo );
  group.get( symbol );
  group.get( side );

  CHECK_EQUAL( "A", clOrdID.getValue() );
  CHECK_EQUAL( 1, listSeqNo );
  CHECK_EQUAL( "DELL", symbol );
  CHECK_EQUAL( '1', side );

  object.getGroup( 2, group );
  group.get( clOrdID );
  group.get( listSeqNo );
  group.get( symbol );
  group.get( side );

  CHECK_EQUAL( "B", clOrdID.getValue() );
  CHECK_EQUAL( 2, listSeqNo );
  CHECK_EQUAL( "LNUX", symbol );
  CHECK_EQUAL( '2', side );

  object.getGroup( 3, group );
  group.get( clOrdID );
  group.get( listSeqNo );
  group.get( symbol );
  group.get( side );

  CHECK_EQUAL( "C", clOrdID.getValue() );
  CHECK_EQUAL( 3, listSeqNo );
  CHECK_EQUAL( "RHAT", symbol );
  CHECK_EQUAL( '3', side );

  object.setString
    ( "8=FIX.4.2\0019=26\00135=E\00166=1\00168=3\00173=0\001"
      "394=0\00110=137\001", true, &dataDictionary );
}